

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle *lightSampler,
                 CameraHandle *camera,SamplerHandle *sampler,optional<pbrt::Point2<float>_> *pRaster
                 ,Float *misWeightPtr)

{
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  this;
  Vertex *pVVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Tuple2<pbrt::Point2,_float> TVar16;
  Tuple2<pbrt::Point2,_float> TVar17;
  bool bVar18;
  int iVar19;
  SurfaceInteraction *pSVar20;
  Normal3f *pNVar21;
  ulong uVar22;
  long lVar23;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  sampler_00;
  ulong uVar24;
  long lVar25;
  HaltonSampler *pHVar26;
  Vertex *pVVar27;
  DebugMLTSampler *pDVar28;
  long in_FS_OFFSET;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Float FVar31;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar32;
  undefined8 uVar33;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar37 [64];
  undefined1 auVar61 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  Float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar49 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar58 [64];
  undefined1 extraout_var_15 [56];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined4 uVar62;
  undefined8 uVar63;
  undefined1 auVar72 [56];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar73 [16];
  SampledSpectrum SVar74;
  optional<pbrt::SampledLight> sampledLight;
  RNG rng_1;
  RNG rng;
  optional<pbrt::CameraWiSample> cs;
  float local_3d8;
  float afStack_3d4 [3];
  SampledWavelengths *local_3c8;
  DispatchSplit<9> local_3b9;
  undefined1 local_3b8 [16];
  ulong local_3a8;
  Integrator *local_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  Vertex *local_380;
  undefined8 local_378;
  float local_370;
  float local_36c;
  Float local_368;
  Float FStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  Vertex *local_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  float fStack_338;
  float fStack_334;
  Float FStack_330;
  Float FStack_32c;
  float fStack_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  Interval<float> local_2f8;
  Interval<float> IStack_2f0;
  Interval<float> local_2e8;
  undefined8 uStack_2e0;
  Vertex *local_2d8;
  undefined4 local_2cc;
  RNG local_2c8;
  undefined8 *puStack_2b8;
  undefined4 *puStack_2b0;
  undefined1 local_2a8 [120];
  Interaction local_230;
  bool local_1e0;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_1d8;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_1d0;
  undefined8 local_1c8;
  anon_struct_8_0_00000001_for___align local_1c0;
  undefined1 local_1b8 [24];
  anon_union_248_3_83785cfc_for_Vertex_2 local_1a0;
  BxDFHandle local_a0;
  undefined1 local_98 [16];
  undefined8 uStack_88;
  Tuple3<pbrt::Vector3,_float> TStack_80;
  undefined1 local_74 [16];
  undefined8 local_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar50 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 auVar68 [64];
  
  TVar17.y = (float)local_348._4_4_;
  TVar17.x = (float)local_348._0_4_;
  uVar63 = 0;
  local_3d8 = 0.0;
  afStack_3d4[0] = 0.0;
  afStack_3d4[1] = 0.0;
  afStack_3d4[2] = 0.0;
  if ((s != 0 && 1 < t) && (cameraVertices[(ulong)(uint)t - 1].type == Light)) {
    uVar33 = 0;
    goto LAB_004074df;
  }
  local_1b8._4_16_ = ZEXT816(0);
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
  local_1a0.ei.super_Interaction.time = 0.0;
  local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_1a0._60_4_ = 0;
  local_1a0.ei.super_Interaction.mediumInterface = (MediumInterface *)0x0;
  local_1a0.ei.super_Interaction.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (MediumHandle)
          (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0x0;
  local_1a0.ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
  local_a0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )0;
  local_98._0_4_ = 1.0;
  local_98._4_4_ = 0.0;
  local_98._8_4_ = 0.0;
  local_98._12_4_ = 0.0;
  uStack_88._0_4_ = 1.0;
  uStack_88._4_4_ = 0.0;
  TStack_80.x = 0.0;
  TStack_80.y = 0.0;
  TStack_80.z = 1.0;
  local_64._0_4_ = 0.0;
  local_64._4_4_ = 0.0;
  local_74._0_5_ = 0;
  local_74._5_3_ = 0;
  local_74._8_4_ = 0.0;
  local_74[0xc] = false;
  local_3c8 = lambda;
  local_3a0 = integrator;
  local_380 = cameraVertices;
  local_350 = lightVertices;
  if (s == 0) {
    if ((cameraVertices[(long)t + -1].type != Light) &&
       ((uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340),
        cameraVertices[(long)t + -1].type != Surface ||
        (local_348 = (undefined1  [8])TVar17,
        uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340),
        (cameraVertices[(long)t + -1].field_2.si.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits & 0xffffffffffff) == 0)))) goto LAB_00407383;
    auVar61 = ZEXT856(0);
    auVar72 = ZEXT856(0);
    SVar74 = Vertex::Le(cameraVertices + (long)t + -1,&integrator->infiniteLights,
                        cameraVertices + (long)t + -2,lambda);
    auVar64._0_8_ = SVar74.values.values._8_8_;
    auVar64._8_56_ = auVar72;
    auVar38._0_8_ = SVar74.values.values._0_8_;
    auVar38._8_56_ = auVar61;
    auVar29 = vmovlhps_avx(auVar38._0_16_,auVar64._0_16_);
    local_3d8 = auVar29._0_4_ * cameraVertices[(long)t + -1].beta.values.values[0];
    afStack_3d4[0] = auVar29._4_4_ * cameraVertices[(long)t + -1].beta.values.values[1];
    afStack_3d4[1] = auVar29._8_4_ * cameraVertices[(long)t + -1].beta.values.values[2];
    afStack_3d4[2] = auVar29._12_4_ * cameraVertices[(long)t + -1].beta.values.values[3];
LAB_004066f8:
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
  }
  else if (t == 1) {
    pVVar1 = lightVertices + (long)s + -1;
    bVar18 = Vertex::IsConnectible(pVVar1);
    pVVar27 = local_350;
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (!bVar18) goto LAB_00407383;
    local_398 = (undefined1  [8])&local_350[(long)s + -1].field_2;
    uVar22 = (sampler->
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
    uVar9 = (ushort)(uVar22 >> 0x30);
    if (uVar22 >> 0x30 < 5) {
      pHVar26 = (HaltonSampler *)(uVar22 & 0xffffffffffff);
      if (uVar9 < 3) {
        if (uVar9 == 2) {
          auVar37._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar26);
          auVar37._8_56_ = extraout_var_01;
          auVar29 = auVar37._0_16_;
        }
        else {
          auVar45._0_8_ = HaltonSampler::Get2D(pHVar26);
          auVar45._8_56_ = extraout_var_05;
          auVar29 = auVar45._0_16_;
        }
      }
      else if (uVar9 == 3) {
        auVar43._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar26);
        auVar43._8_56_ = extraout_var_03;
        auVar29 = auVar43._0_16_;
      }
      else {
        auVar48._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar26);
        auVar48._8_56_ = extraout_var_08;
        auVar29 = auVar48._0_16_;
      }
    }
    else {
      pDVar28 = (DebugMLTSampler *)(uVar22 & 0xffffffffffff);
      if (uVar9 < 7) {
        if (uVar9 == 6) {
          auVar42._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar28);
          auVar42._8_56_ = extraout_var_02;
          auVar29 = auVar42._0_16_;
        }
        else {
          auVar47._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar28);
          auVar47._8_56_ = extraout_var_07;
          auVar29 = auVar47._0_16_;
        }
      }
      else if (uVar9 == 7) {
        auVar44._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar28);
        auVar44._8_56_ = extraout_var_04;
        auVar29 = auVar44._0_16_;
      }
      else {
        local_368 = DebugMLTSampler::Get1D(pDVar28);
        FStack_364 = extraout_XMM0_Db;
        uStack_360 = extraout_XMM0_Dc;
        uStack_35c = extraout_XMM0_Dd;
        auVar49._0_4_ = DebugMLTSampler::Get1D(pDVar28);
        auVar49._4_60_ = extraout_var;
        auVar12._4_4_ = FStack_364;
        auVar12._0_4_ = local_368;
        auVar12._8_4_ = uStack_360;
        auVar12._12_4_ = uStack_35c;
        auVar29 = vinsertps_avx(auVar12,auVar49._0_16_,0x10);
      }
    }
    uVar63 = vmovlps_avx(auVar29);
    local_348._0_4_ = (undefined4)uVar63;
    local_348._4_4_ = (undefined4)((ulong)uVar63 >> 0x20);
    CameraHandle::SampleWi
              ((optional<pbrt::CameraWiSample> *)local_2a8,camera,(Interaction *)local_398,
               (Point2f *)local_348,local_3c8);
    if (local_1e0 == true) {
      if (pRaster->set == true) {
        pRaster->set = false;
      }
      pRaster->optionalValue =
           (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)
           local_2a8._32_8_;
      pRaster->set = true;
      local_1a0.ei.field_0 =
           (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)
           (camera->
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           ).bits;
      auVar15._8_8_ = local_2a8._8_8_;
      auVar15._0_8_ = local_2a8._0_8_;
      auVar6._4_4_ = local_2a8._28_4_;
      auVar6._0_4_ = local_2a8._28_4_;
      auVar6._8_4_ = local_2a8._28_4_;
      auVar6._12_4_ = local_2a8._28_4_;
      local_1b8._4_16_ = vdivps_avx512vl(auVar15,auVar6);
      local_348._4_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      uStack_340._0_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      uStack_340._4_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      fStack_338 = local_230.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      fStack_334 = local_230.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
      FStack_330 = local_230.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
      FStack_32c = local_230.time;
      fStack_328 = local_230.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_324 = local_230.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      fStack_320 = local_230.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      fStack_31c = local_230.n.super_Tuple3<pbrt::Normal3,_float>.x;
      fStack_318 = local_230.n.super_Tuple3<pbrt::Normal3,_float>.y;
      fStack_314 = local_230.n.super_Tuple3<pbrt::Normal3,_float>.z;
      fStack_310 = local_230.uv.super_Tuple2<pbrt::Point2,_float>.x;
      fStack_30c = local_230.uv.super_Tuple2<pbrt::Point2,_float>.y;
      uStack_308 = local_230._60_4_;
      uStack_304 = SUB84(local_230.mediumInterface,0);
      uStack_300 = (undefined4)((ulong)local_230.mediumInterface >> 0x20);
      local_74._8_4_ = 0.0;
      local_74[0xc] = false;
      local_74._0_5_ = 0;
      local_74._5_3_ = 0;
      local_1b8._0_4_ = Camera;
      local_1a0._64_8_ = local_230.mediumInterface;
      local_1b8._20_4_ = local_348._0_4_;
      local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_348._4_4_;
      local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)uStack_340;
      local_1a0.ei.super_Interaction.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (MediumHandle)
              (MediumHandle)
              local_230.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      local_a0.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
               )0;
      local_98._0_4_ = 1.0;
      local_98._4_4_ = 0.0;
      local_98._8_4_ = 0.0;
      local_98._12_4_ = 0.0;
      uStack_88._0_4_ = 1.0;
      uStack_88._4_4_ = 0.0;
      TStack_80.x = 0.0;
      TStack_80.y = 0.0;
      TStack_80.z = 1.0;
      local_64._0_4_ = 0.0;
      local_64._4_4_ = 0.0;
      auVar61 = ZEXT856(0);
      auVar72 = ZEXT856((ulong)local_230.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z);
      local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = uStack_340._4_4_;
      local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = fStack_338;
      local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = fStack_334;
      local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = FStack_330;
      local_1a0.ei.super_Interaction.time = FStack_32c;
      local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_328;
      local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_324;
      local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_320;
      local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_31c;
      local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_318;
      local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_314;
      local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = fStack_310;
      local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = fStack_30c;
      local_1a0._60_4_ = uStack_308;
      SVar74 = Vertex::f(pVVar1,(Vertex *)local_1b8,Importance);
      auVar68._0_8_ = SVar74.values.values._8_8_;
      auVar68._8_56_ = auVar72;
      auVar50._0_8_ = SVar74.values.values._0_8_;
      auVar50._8_56_ = auVar61;
      auVar29 = vmovlhps_avx(auVar50._0_16_,auVar68._0_16_);
      local_3d8 = auVar29._0_4_ * pVVar27[(long)s + -1].beta.values.values[0] *
                  (float)local_1b8._4_4_;
      afStack_3d4[0] =
           auVar29._4_4_ * pVVar27[(long)s + -1].beta.values.values[1] * (float)local_1b8._8_4_;
      afStack_3d4[1] =
           auVar29._8_4_ * pVVar27[(long)s + -1].beta.values.values[2] * (float)local_1b8._12_4_;
      afStack_3d4[2] =
           auVar29._12_4_ * pVVar27[(long)s + -1].beta.values.values[3] * (float)local_1b8._16_4_;
      if ((((pVVar27[(long)s + -1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>
             .x != 0.0) ||
           (fVar32 = pVVar27[(long)s + -1].field_2.ei.super_Interaction.n.
                     super_Tuple3<pbrt::Normal3,_float>.y, fVar32 != 0.0)) || (NAN(fVar32))) ||
         ((fVar32 = pVVar27[(long)s + -1].field_2.ei.super_Interaction.n.
                    super_Tuple3<pbrt::Normal3,_float>.z, fVar32 != 0.0 || (NAN(fVar32))))) {
        if (local_1e0 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
        }
        pNVar21 = &(pVVar1->field_2).ei.super_Interaction.n;
        if (pVVar1->type == Surface) {
          pNVar21 = (Normal3f *)((pVVar1->field_2).mi.sigma_maj.values.values + 2);
        }
        fVar32 = (pNVar21->super_Tuple3<pbrt::Normal3,_float>).z;
        auVar73 = ZEXT416((uint)(fVar32 * (float)local_2a8._24_4_));
        auVar29 = vfmadd132ss_fma(ZEXT416((uint)(pNVar21->super_Tuple3<pbrt::Normal3,_float>).y),
                                  auVar73,ZEXT416((uint)local_2a8._20_4_));
        auVar73 = vfmsub213ss_fma(ZEXT416((uint)local_2a8._24_4_),ZEXT416((uint)fVar32),auVar73);
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar73._0_4_)),
                                  ZEXT416((uint)(pNVar21->super_Tuple3<pbrt::Normal3,_float>).x),
                                  ZEXT416((uint)local_2a8._16_4_));
        uVar62 = auVar29._0_4_;
        auVar34._4_4_ = uVar62;
        auVar34._0_4_ = uVar62;
        auVar34._8_4_ = uVar62;
        auVar34._12_4_ = uVar62;
        auVar7._8_4_ = 0x7fffffff;
        auVar7._0_8_ = 0x7fffffff7fffffff;
        auVar7._12_4_ = 0x7fffffff;
        auVar29 = vandps_avx512vl(auVar34,auVar7);
        local_3d8 = auVar29._0_4_ * local_3d8;
        afStack_3d4[0] = auVar29._4_4_ * afStack_3d4[0];
        afStack_3d4[1] = auVar29._8_4_ * afStack_3d4[1];
        afStack_3d4[2] = auVar29._12_4_ * afStack_3d4[2];
      }
      if ((local_3d8 == 0.0) && (!NAN(local_3d8))) {
        uVar22 = 0;
        while (uVar24 = uVar22, uVar24 != 3) {
          if ((afStack_3d4[uVar24] != 0.0) || (uVar22 = uVar24 + 1, NAN(afStack_3d4[uVar24])))
          break;
        }
        if (2 < uVar24) goto LAB_00406e37;
      }
      if (local_1e0 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
      }
      uVar22 = (((ulong)(local_2a8._32_8_ * -0x395b586ca42e166b) >> 0x2f ^
                local_2a8._32_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8)
               * -0x395b586ca42e166b;
      uVar22 = (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b;
      uStack_308 = SUB84(local_230.mediumInterface,0);
      uStack_304 = (undefined4)((ulong)local_230.mediumInterface >> 0x20);
      local_348._0_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      local_348._4_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      uStack_340._0_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      uStack_340._4_4_ =
           local_230.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      fStack_338 = local_230.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
      fStack_334 = local_230.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
      FStack_330 = local_230.time;
      FStack_32c = local_230.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_328 = local_230.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      fStack_324 = local_230.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      fStack_320 = local_230.n.super_Tuple3<pbrt::Normal3,_float>.x;
      fStack_31c = local_230.n.super_Tuple3<pbrt::Normal3,_float>.y;
      fStack_318 = local_230.n.super_Tuple3<pbrt::Normal3,_float>.z;
      fStack_314 = local_230.uv.super_Tuple2<pbrt::Point2,_float>.x;
      fStack_310 = local_230.uv.super_Tuple2<pbrt::Point2,_float>.y;
      fStack_30c = local_230._60_4_;
      uStack_300 = (undefined4)
                   local_230.medium.
                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                   .bits;
      uStack_2fc = local_230.medium.
                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                   .bits._4_4_;
      uVar24 = 0x13745e0cb198fe90;
      lVar25 = 0;
      do {
        plVar2 = (long *)(local_348 + lVar25);
        lVar25 = lVar25 + 8;
        uVar24 = (uVar24 ^ ((ulong)(*plVar2 * -0x395b586ca42e166b) >> 0x2f ^
                           *plVar2 * -0x395b586ca42e166b) * -0x395b586ca42e166b) *
                 -0x395b586ca42e166b;
      } while (lVar25 != 0x50);
      uVar22 = uVar22 >> 0x2f ^ uVar22;
      uVar24 = (uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b;
      local_2c8.inc = uVar22 * 2 + 1;
      local_2c8.state =
           ((uVar24 >> 0x2f ^ uVar24) + 1) * 0x5851f42d4c957f2d + uVar22 * -0x4f5c17a566d501a4 + 1;
      auVar61 = ZEXT856((ulong)local_230.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
      auVar72 = ZEXT856(0);
      SVar74 = Integrator::Tr(local_3a0,(Interaction *)(local_2a8 + 0x28),&local_230,local_3c8,
                              &local_2c8);
      auVar69._0_8_ = SVar74.values.values._8_8_;
      auVar69._8_56_ = auVar72;
      auVar51._0_8_ = SVar74.values.values._0_8_;
      auVar51._8_56_ = auVar61;
      auVar29 = vmovlhps_avx(auVar51._0_16_,auVar69._0_16_);
      local_3d8 = auVar29._0_4_ * local_3d8;
      afStack_3d4[0] = auVar29._4_4_ * afStack_3d4[0];
      afStack_3d4[1] = auVar29._8_4_ * afStack_3d4[1];
      afStack_3d4[2] = auVar29._12_4_ * afStack_3d4[2];
    }
LAB_00406e37:
    TVar16.y = (float)local_348._4_4_;
    TVar16.x = (float)local_348._0_4_;
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (local_1e0 == true) {
      local_1e0 = false;
      local_348 = (undefined1  [8])TVar16;
      uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    }
  }
  else if (s == 1) {
    pVVar1 = cameraVertices + (long)t + -1;
    auVar29 = in_ZMM2._0_16_;
    bVar18 = Vertex::IsConnectible(pVVar1);
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (bVar18) {
      local_2a8._0_8_ =
           (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      FVar31 = detail::DispatchSplit<8>::operator()
                         ((DispatchSplit<8> *)local_348,local_2a8,(ulong)local_2a8._0_8_ >> 0x30);
      pVVar27 = local_380;
      uVar22 = (lightSampler->
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               ).bits;
      local_398 = (undefined1  [8])0xffffffffffff;
      sVar10 = (short)(uVar22 >> 0x30);
      if (uVar22 >> 0x30 < 3) {
        if (sVar10 == 2) {
          PowerLightSampler::Sample
                    ((optional<pbrt::SampledLight> *)local_3b8,
                     (PowerLightSampler *)(uVar22 & 0xffffffffffff),FVar31);
        }
        else {
LAB_0040692f:
          lVar25 = *(long *)((uVar22 & 0xffffffffffff) + 0x18);
          if (lVar25 != 0) {
            auVar29 = vcvtusi2ss_avx512f(auVar29,lVar25);
            fVar32 = auVar29._0_4_;
            iVar19 = (int)lVar25 + -1;
            if ((int)(FVar31 * fVar32) <= iVar19) {
              iVar19 = (int)(FVar31 * fVar32);
            }
            lVar25 = *(long *)((uVar22 & 0xffffffffffff) + 8);
            goto LAB_00406953;
          }
LAB_00406975:
          local_3b8._0_12_ = ZEXT412(0);
          local_3b8._12_4_ = 0;
          local_3a8 = 0;
        }
      }
      else {
        if (sVar10 != 3) goto LAB_0040692f;
        lVar25 = *(long *)((uVar22 & 0xffffffffffff) + 0x20);
        if (lVar25 == 0) goto LAB_00406975;
        auVar29 = vcvtusi2ss_avx512f(auVar29,lVar25);
        fVar32 = auVar29._0_4_;
        iVar19 = (int)lVar25 + -1;
        if ((int)(FVar31 * fVar32) <= iVar19) {
          iVar19 = (int)(FVar31 * fVar32);
        }
        lVar25 = *(long *)((uVar22 & 0xffffffffffff) + 0x10);
LAB_00406953:
        local_3a8 = CONCAT71(local_3a8._1_7_,1);
        local_3b8._8_4_ = 1.0 / fVar32;
        local_3b8._0_8_ = *(undefined8 *)(lVar25 + (long)iVar19 * 8);
      }
      if (local_3a8._0_1_ == true) {
        uVar63 = local_3b8._0_8_;
        local_36c = (float)local_3b8._8_4_;
        local_378 = 0;
        local_370 = 0.0;
        local_2d8 = pVVar1;
        if ((((pVVar27[(long)t + -1].field_2.ei.super_Interaction.n.
               super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
             (fVar32 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.n.
                       super_Tuple3<pbrt::Normal3,_float>.y, fVar32 != 0.0)) || (NAN(fVar32))) ||
           ((fVar32 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.n.
                      super_Tuple3<pbrt::Normal3,_float>.z, fVar32 != 0.0 || (NAN(fVar32))))) {
          pSVar20 = Interaction::AsSurface(&pVVar27[(long)t + -1].field_2.ei.super_Interaction);
          local_2f8 = (pSVar20->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_2f0 = (pSVar20->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          local_2e8 = (pSVar20->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          uVar3 = (pSVar20->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar4 = (pSVar20->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          fVar32 = (pSVar20->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_370 = (pSVar20->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_378._0_4_ = (pSVar20->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_378._4_4_ = (pSVar20->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_368 = (Float)uVar3;
          FStack_364 = (Float)uVar4;
        }
        else {
          local_2f8 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.pi.
                      super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_2f0 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.pi.
                       super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          local_2e8 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.pi.
                      super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_370 = 0.0;
          local_378 = 0;
          local_368 = 0.0;
          FStack_364 = 0.0;
          fVar32 = 0.0;
        }
        uStack_2e0 = 0;
        uVar22 = (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
        uVar9 = (ushort)(uVar22 >> 0x30);
        if (uVar22 >> 0x30 < 5) {
          pHVar26 = (HaltonSampler *)((ulong)local_398 & uVar22);
          local_398 = (undefined1  [8])pHVar26;
          if (uVar22 < 0x3000000000000) {
            if (uVar9 == 2) {
              auVar46._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar26);
              auVar46._8_56_ = extraout_var_06;
              auVar29 = auVar46._0_16_;
            }
            else {
              auVar55._0_8_ = HaltonSampler::Get2D(pHVar26);
              auVar55._8_56_ = extraout_var_12;
              auVar29 = auVar55._0_16_;
            }
          }
          else if (uVar9 == 3) {
            auVar53._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar26);
            auVar53._8_56_ = extraout_var_10;
            auVar29 = auVar53._0_16_;
          }
          else {
            auVar57._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar26);
            auVar57._8_56_ = extraout_var_14;
            auVar29 = auVar57._0_16_;
          }
        }
        else {
          pDVar28 = (DebugMLTSampler *)(uVar22 & 0xffffffffffff);
          if (uVar9 < 7) {
            if (uVar9 == 6) {
              auVar52._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar28);
              auVar52._8_56_ = extraout_var_09;
              auVar29 = auVar52._0_16_;
            }
            else {
              auVar56._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar28);
              auVar56._8_56_ = extraout_var_13;
              auVar29 = auVar56._0_16_;
            }
          }
          else if (uVar9 == 7) {
            auVar54._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar28);
            auVar54._8_56_ = extraout_var_11;
            auVar29 = auVar54._0_16_;
          }
          else {
            local_398._0_4_ = DebugMLTSampler::Get1D(pDVar28);
            local_398._4_4_ = extraout_XMM0_Db_00;
            fStack_390 = (float)extraout_XMM0_Dc_00;
            fStack_38c = (float)extraout_XMM0_Dd_00;
            auVar58._0_4_ = DebugMLTSampler::Get1D(pDVar28);
            auVar58._4_60_ = extraout_var_00;
            auVar29 = vinsertps_avx(_local_398,auVar58._0_16_,0x10);
          }
        }
        local_58 = *(undefined8 *)(local_3c8->lambda).values;
        uStack_50 = *(undefined8 *)((local_3c8->lambda).values + 2);
        uStack_48 = *(undefined8 *)(local_3c8->pdf).values;
        uStack_40 = *(undefined8 *)((local_3c8->pdf).values + 2);
        puStack_2b8 = &local_58;
        local_348._0_4_ = local_2f8.low;
        local_348._4_4_ = local_2f8.high;
        uStack_340._0_4_ = IStack_2f0.low;
        uStack_340._4_4_ = IStack_2f0.high;
        auVar73._8_8_ = uStack_2e0;
        auVar73._0_4_ = local_2e8.low;
        auVar73._4_4_ = local_2e8.high;
        uVar33 = vmovlps_avx(auVar73);
        fStack_338 = (float)uVar33;
        fStack_334 = (float)((ulong)uVar33 >> 0x20);
        FStack_330 = local_368;
        FStack_32c = FStack_364;
        fStack_324 = (float)local_378;
        fStack_320 = (float)((ulong)local_378 >> 0x20);
        fStack_31c = local_370;
        local_2c8.inc = (uint64_t)&local_1c8;
        local_1c8 = vmovlps_avx(auVar29);
        puStack_2b0 = &local_2cc;
        local_2cc = 1;
        local_2c8.state = (uint64_t)local_348;
        local_1c0 = (anon_struct_8_0_00000001_for___align)uVar63;
        fStack_328 = fVar32;
        detail::DispatchSplit<9>::operator()(local_2a8,&local_3b9);
        pVVar1 = local_2d8;
        if (0.0 < (float)local_2a8._28_4_) {
          auVar29._8_8_ = local_2a8._8_8_;
          auVar29._0_8_ = local_2a8._0_8_;
          fVar5 = (float)local_2a8._28_4_ * local_36c;
          auVar35._4_4_ = fVar5;
          auVar35._0_4_ = fVar5;
          auVar35._8_4_ = fVar5;
          auVar35._12_4_ = fVar5;
          local_1b8._4_16_ = vdivps_avx(auVar29,auVar35);
          local_348._4_4_ = (undefined4)local_2a8._40_8_;
          uStack_340._0_4_ = SUB84(local_2a8._40_8_,4);
          uStack_340._4_4_ = (float)local_2a8._48_8_;
          fStack_338 = SUB84(local_2a8._48_8_,4);
          fStack_334 = (float)local_2a8._56_8_;
          FStack_330 = SUB84(local_2a8._56_8_,4);
          FStack_32c = (Float)local_2a8._64_8_;
          fStack_328 = SUB84(local_2a8._64_8_,4);
          fStack_324 = (float)local_2a8._72_8_;
          fStack_320 = SUB84(local_2a8._72_8_,4);
          fStack_31c = (float)local_2a8._80_8_;
          fStack_318 = SUB84(local_2a8._80_8_,4);
          fStack_314 = (float)local_2a8._88_8_;
          fStack_310 = SUB84(local_2a8._88_8_,4);
          fStack_30c = (float)local_2a8._96_8_;
          uStack_308 = SUB84(local_2a8._96_8_,4);
          uStack_304 = (undefined4)local_2a8._104_8_;
          uStack_300 = SUB84(local_2a8._104_8_,4);
          local_74._8_4_ = 0.0;
          local_74[0xc] = false;
          local_74._0_5_ = 0;
          local_74._5_3_ = 0;
          local_1b8._0_4_ = Light;
          local_1a0._64_8_ = local_2a8._104_8_;
          local_1b8._20_4_ = local_348._0_4_;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_348._4_4_;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)uStack_340;
          local_1a0.ei.super_Interaction.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (MediumHandle)(MediumHandle)local_2a8._112_8_;
          local_1a0.ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)uVar63;
          local_a0.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )0;
          local_98._0_4_ = 1.0;
          local_98._4_4_ = 0.0;
          local_98._8_4_ = 0.0;
          local_98._12_4_ = 0.0;
          uStack_88._0_4_ = 1.0;
          uStack_88._4_4_ = 0.0;
          TStack_80.x = 0.0;
          TStack_80.y = 0.0;
          TStack_80.z = 1.0;
          local_64._0_4_ = 0.0;
          local_64._4_4_ = 0.0;
          local_1d0.bits =
               (lightSampler->
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               ).bits;
          auVar72 = ZEXT856((ulong)local_2a8._56_8_);
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = uStack_340._4_4_;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = fStack_338;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = fStack_334;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = FStack_330;
          local_1a0.ei.super_Interaction.time = FStack_32c;
          local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_328;
          local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_324;
          local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_320;
          local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_31c;
          local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_318;
          local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_314;
          local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = fStack_310;
          local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = fStack_30c;
          local_1a0._60_4_ = uStack_308;
          FVar31 = Vertex::PdfLightOrigin
                             ((Vertex *)local_1b8,&local_3a0->infiniteLights,local_2d8,
                              (LightSamplerHandle *)&local_1d0);
          local_64._0_4_ = FVar31;
          auVar61 = extraout_var_15;
          SVar74 = Vertex::f(pVVar1,(Vertex *)local_1b8,Radiance);
          auVar70._0_8_ = SVar74.values.values._8_8_;
          auVar70._8_56_ = auVar72;
          auVar59._0_8_ = SVar74.values.values._0_8_;
          auVar59._8_56_ = auVar61;
          auVar29 = vmovlhps_avx(auVar59._0_16_,auVar70._0_16_);
          local_3d8 = auVar29._0_4_ * pVVar27[(long)t + -1].beta.values.values[0] *
                      (float)local_1b8._4_4_;
          afStack_3d4[0] =
               auVar29._4_4_ * pVVar27[(long)t + -1].beta.values.values[1] * (float)local_1b8._8_4_;
          afStack_3d4[1] =
               auVar29._8_4_ * pVVar27[(long)t + -1].beta.values.values[2] * (float)local_1b8._12_4_
          ;
          afStack_3d4[2] =
               auVar29._12_4_ * pVVar27[(long)t + -1].beta.values.values[3] *
               (float)local_1b8._16_4_;
          if (((pVVar27[(long)t + -1].field_2.ei.super_Interaction.n.
                super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
              (fVar5 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.n.
                       super_Tuple3<pbrt::Normal3,_float>.y, fVar5 != 0.0)) ||
             ((NAN(fVar5) ||
              ((fVar5 = pVVar27[(long)t + -1].field_2.ei.super_Interaction.n.
                        super_Tuple3<pbrt::Normal3,_float>.z, fVar5 != 0.0 || (NAN(fVar5))))))) {
            pNVar21 = &(pVVar1->field_2).ei.super_Interaction.n;
            if (pVVar1->type == Surface) {
              pNVar21 = (Normal3f *)((pVVar1->field_2).mi.sigma_maj.values.values + 2);
            }
            fVar5 = (pNVar21->super_Tuple3<pbrt::Normal3,_float>).z;
            auVar73 = ZEXT416((uint)(fVar5 * (float)local_2a8._24_4_));
            auVar29 = vfmadd132ss_fma(ZEXT416((uint)(pNVar21->super_Tuple3<pbrt::Normal3,_float>).y)
                                      ,auVar73,ZEXT416((uint)local_2a8._20_4_));
            auVar73 = vfmsub213ss_fma(ZEXT416((uint)local_2a8._24_4_),ZEXT416((uint)fVar5),auVar73);
            auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar73._0_4_)),
                                      ZEXT416((uint)(pNVar21->super_Tuple3<pbrt::Normal3,_float>).x)
                                      ,ZEXT416((uint)local_2a8._16_4_));
            uVar62 = auVar29._0_4_;
            auVar36._4_4_ = uVar62;
            auVar36._0_4_ = uVar62;
            auVar36._8_4_ = uVar62;
            auVar36._12_4_ = uVar62;
            auVar8._8_4_ = 0x7fffffff;
            auVar8._0_8_ = 0x7fffffff7fffffff;
            auVar8._12_4_ = 0x7fffffff;
            auVar29 = vandps_avx512vl(auVar36,auVar8);
            local_3d8 = auVar29._0_4_ * local_3d8;
            afStack_3d4[0] = auVar29._4_4_ * afStack_3d4[0];
            afStack_3d4[1] = auVar29._8_4_ * afStack_3d4[1];
            afStack_3d4[2] = auVar29._12_4_ * afStack_3d4[2];
          }
          if ((local_3d8 == 0.0) && (!NAN(local_3d8))) {
            uVar22 = 0;
            while (uVar24 = uVar22, uVar24 != 3) {
              if ((afStack_3d4[uVar24] != 0.0) || (uVar22 = uVar24 + 1, NAN(afStack_3d4[uVar24])))
              break;
            }
            if (2 < uVar24) goto LAB_00407377;
          }
          auVar13._8_4_ = IStack_2f0.low;
          auVar13._12_4_ = IStack_2f0.high;
          auVar13._0_4_ = local_2f8.low;
          auVar13._4_4_ = local_2f8.high;
          auVar29 = vhaddps_avx(auVar13,auVar13);
          auVar73 = vmovshdup_avx(auVar29);
          auVar73 = vinsertps_avx(ZEXT416((uint)(auVar29._0_4_ * 0.5)),
                                  ZEXT416((uint)(auVar73._0_4_ * 0.5)),0x10);
          auVar61 = ZEXT856(auVar73._8_8_);
          auVar14._8_8_ = uStack_2e0;
          auVar14._0_4_ = local_2e8.low;
          auVar14._4_4_ = local_2e8.high;
          auVar29 = vhaddps_avx(auVar14,auVar14);
          auVar72 = (undefined1  [56])0x0;
          uVar22 = auVar73._0_8_ * -0x395b586ca42e166b;
          uVar22 = (CONCAT44((int)(uVar22 >> 0x20),auVar29._0_4_ * 0.5) ^
                   ((uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                   -0x395b586ca42e166b) * -0x395b586ca42e166b;
          uVar22 = (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b;
          uVar22 = uVar22 >> 0x2f ^ uVar22;
          uVar24 = CONCAT44(FStack_364,local_368) * -0x395b586ca42e166b;
          uVar24 = ((ulong)(uint)fVar32 ^
                   ((uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                   -0x395b586ca42e166b) * -0x395b586ca42e166b;
          uVar24 = (uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b;
          uStack_340 = uVar22 * 2 + 1;
          local_348 = (undefined1  [8])
                      (((uVar24 >> 0x2f ^ uVar24) + 1) * 0x5851f42d4c957f2d +
                       uVar22 * -0x4f5c17a566d501a4 + 1);
          SVar74 = Integrator::Tr(local_3a0,&pVVar27[(long)t + -1].field_2.ei.super_Interaction,
                                  (Interaction *)(local_2a8 + 0x28),local_3c8,(RNG *)local_348);
          auVar71._0_8_ = SVar74.values.values._8_8_;
          auVar71._8_56_ = auVar72;
          auVar60._0_8_ = SVar74.values.values._0_8_;
          auVar60._8_56_ = auVar61;
          auVar29 = vmovlhps_avx(auVar60._0_16_,auVar71._0_16_);
          local_3d8 = auVar29._0_4_ * local_3d8;
          afStack_3d4[0] = auVar29._4_4_ * afStack_3d4[0];
          afStack_3d4[1] = auVar29._8_4_ * afStack_3d4[1];
          afStack_3d4[2] = auVar29._12_4_ * afStack_3d4[2];
        }
      }
LAB_00407377:
      if (local_3a8._0_1_ == true) {
        local_3a8 = local_3a8 & 0xffffffffffffff00;
      }
    }
  }
  else {
    this.bits = (uintptr_t)(lightVertices + (long)s + -1);
    auVar61 = ZEXT856(0);
    auVar72 = ZEXT856(0);
    bVar18 = Vertex::IsConnectible((Vertex *)this.bits);
    pVVar1 = local_380;
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (bVar18) {
      pVVar27 = local_380 + (long)t + -1;
      bVar18 = Vertex::IsConnectible(pVVar27);
      uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
      if (bVar18) {
        SVar74 = Vertex::f((Vertex *)this.bits,pVVar27,Importance);
        auVar65._0_8_ = SVar74.values.values._8_8_;
        auVar65._8_56_ = auVar72;
        auVar39._0_8_ = SVar74.values.values._0_8_;
        auVar39._8_56_ = auVar61;
        auVar29 = vmovlhps_avx(auVar39._0_16_,auVar65._0_16_);
        local_398._0_4_ = auVar29._0_4_ * lightVertices[(long)s + -1].beta.values.values[0];
        local_398._4_4_ = auVar29._4_4_ * lightVertices[(long)s + -1].beta.values.values[1];
        fStack_390 = auVar29._8_4_ * lightVertices[(long)s + -1].beta.values.values[2];
        fStack_38c = auVar29._12_4_ * lightVertices[(long)s + -1].beta.values.values[3];
        auVar61 = ZEXT856(local_398._8_8_);
        sampler_00.bits = this.bits;
        SVar74 = Vertex::f(pVVar27,(Vertex *)this.bits,Radiance);
        auVar66._0_8_ = SVar74.values.values._8_8_;
        auVar66._8_56_ = auVar72;
        auVar40._0_8_ = SVar74.values.values._0_8_;
        auVar40._8_56_ = auVar61;
        auVar29 = vmovlhps_avx(auVar40._0_16_,auVar66._0_16_);
        local_3d8 = auVar29._0_4_ * (float)local_398._0_4_ *
                    pVVar1[(long)t + -1].beta.values.values[0];
        afStack_3d4[0] =
             auVar29._4_4_ * (float)local_398._4_4_ * pVVar1[(long)t + -1].beta.values.values[1];
        afStack_3d4[1] = auVar29._8_4_ * fStack_390 * pVVar1[(long)t + -1].beta.values.values[2];
        afStack_3d4[2] = auVar29._12_4_ * fStack_38c * pVVar1[(long)t + -1].beta.values.values[3];
        auVar61 = ZEXT456(0);
        if ((local_3d8 == 0.0) && (!NAN(local_3d8))) {
          uVar22 = 0;
          while (uVar24 = uVar22, uVar24 != 3) {
            if ((afStack_3d4[uVar24] != 0.0) || (uVar22 = uVar24 + 1, NAN(afStack_3d4[uVar24])))
            break;
          }
          uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
          if (2 < uVar24) goto LAB_00407383;
        }
        auVar72 = (undefined1  [56])0x0;
        SVar74 = G(local_3a0,(SamplerHandle)sampler_00.bits,(Vertex *)this.bits,pVVar27,local_3c8);
        auVar67._0_8_ = SVar74.values.values._8_8_;
        auVar67._8_56_ = auVar72;
        auVar41._0_8_ = SVar74.values.values._0_8_;
        auVar41._8_56_ = auVar61;
        auVar29 = vmovlhps_avx(auVar41._0_16_,auVar67._0_16_);
        local_3d8 = auVar29._0_4_ * local_3d8;
        afStack_3d4[0] = auVar29._4_4_ * afStack_3d4[0];
        afStack_3d4[1] = auVar29._8_4_ * afStack_3d4[1];
        afStack_3d4[2] = auVar29._12_4_ * afStack_3d4[2];
        goto LAB_004066f8;
      }
    }
  }
LAB_00407383:
  *(long *)(in_FS_OFFSET + -0x2b8) = *(long *)(in_FS_OFFSET + -0x2b8) + 1;
  if ((local_3d8 == 0.0) && (!NAN(local_3d8))) {
    uVar22 = 0;
    while (uVar24 = uVar22, uVar24 != 3) {
      if ((afStack_3d4[uVar24] != 0.0) || (uVar22 = uVar24 + 1, NAN(afStack_3d4[uVar24]))) break;
    }
    if (2 < uVar24) {
      *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    }
  }
  lVar25 = (long)(s + -2 + t);
  *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + lVar25;
  *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
  lVar23 = *(long *)(in_FS_OFFSET + -0x720);
  if (lVar25 <= *(long *)(in_FS_OFFSET + -0x720)) {
    lVar23 = lVar25;
  }
  *(long *)(in_FS_OFFSET + -0x720) = lVar23;
  if (lVar25 < *(long *)(in_FS_OFFSET + -0x718)) {
    lVar25 = *(long *)(in_FS_OFFSET + -0x718);
  }
  *(long *)(in_FS_OFFSET + -0x718) = lVar25;
  if ((local_3d8 != 0.0) || (NAN(local_3d8))) {
LAB_00407463:
    local_1d8.bits =
         (lightSampler->
         super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
         ).bits;
    fVar32 = MISWeight(local_3a0,local_350,local_380,(Vertex *)local_1b8,s,t,
                       (LightSamplerHandle *)&local_1d8);
  }
  else {
    uVar22 = 0;
    while (uVar24 = uVar22, uVar24 != 3) {
      if ((afStack_3d4[uVar24] != 0.0) || (uVar22 = uVar24 + 1, NAN(afStack_3d4[uVar24]))) break;
    }
    fVar32 = 0.0;
    if (uVar24 < 3) goto LAB_00407463;
  }
  if (misWeightPtr != (Float *)0x0) {
    *misWeightPtr = fVar32;
  }
  auVar29 = *(undefined1 (*) [16])(local_3c8->pdf).values;
  uVar22 = vcmpps_avx512vl(auVar29,ZEXT416(0) << 0x20,4);
  auVar11._4_4_ = fVar32 * afStack_3d4[0];
  auVar11._0_4_ = fVar32 * local_3d8;
  auVar11._8_4_ = fVar32 * afStack_3d4[1];
  auVar11._12_4_ = fVar32 * afStack_3d4[2];
  auVar29 = vdivps_avx512vl(auVar11,auVar29);
  uVar33 = CONCAT44((uint)((byte)(uVar22 >> 1) & 1) * auVar29._4_4_,
                    (uint)((byte)uVar22 & 1) * auVar29._0_4_);
  auVar30._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar29._8_4_;
  auVar30._0_8_ = uVar33;
  auVar30._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar29._12_4_;
  auVar29 = vshufpd_avx(auVar30,auVar30,1);
  uVar63 = auVar29._0_8_;
LAB_004074df:
  SVar74.values.values[2] = (float)(int)uVar63;
  SVar74.values.values[3] = (float)(int)((ulong)uVar63 >> 0x20);
  SVar74.values.values[0] = (float)(int)uVar33;
  SVar74.values.values[1] = (float)(int)((ulong)uVar33 >> 0x20);
  return (SampledSpectrum)SVar74.values.values;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                // Only check visibility after we know that the path would
                // make a non-zero contribution.
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface())
                    ctx = LightSampleContext(pt.GetInteraction().AsSurface());
                else
                    ctx = LightSampleContext(pt.GetInteraction());
                LightLiSample lightWeight = light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight) {
                    EndpointInteraction ei(lightWeight.pLight, light);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight.L / (lightWeight.pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PdfLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight.wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight.pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}